

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TShaderQualifiers::merge(TShaderQualifiers *this,TShaderQualifiers *src)

{
  byte local_31;
  int local_24;
  int local_20;
  int i_2;
  int i_1;
  int i;
  TShaderQualifiers *src_local;
  TShaderQualifiers *this_local;
  
  if (src->geometry != ElgNone) {
    this->geometry = src->geometry;
  }
  if ((src->pixelCenterInteger & 1U) != 0) {
    this->pixelCenterInteger = (bool)(src->pixelCenterInteger & 1);
  }
  if ((src->originUpperLeft & 1U) != 0) {
    this->originUpperLeft = (bool)(src->originUpperLeft & 1);
  }
  if (src->invocations != -1) {
    this->invocations = src->invocations;
  }
  if (src->vertices != -1) {
    this->vertices = src->vertices;
  }
  if (src->spacing != EvsNone) {
    this->spacing = src->spacing;
  }
  if (src->order != EvoNone) {
    this->order = src->order;
  }
  if ((src->pointMode & 1U) != 0) {
    this->pointMode = true;
  }
  for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
    if (1 < src->localSize[i_2]) {
      this->localSize[i_2] = src->localSize[i_2];
    }
  }
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    local_31 = 1;
    if ((src->localSizeNotDefault[local_20] & 1U) == 0) {
      local_31 = this->localSizeNotDefault[local_20];
    }
    this->localSizeNotDefault[local_20] = (bool)(local_31 & 1);
  }
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    if (src->localSizeSpecId[local_24] != -1) {
      this->localSizeSpecId[local_24] = src->localSizeSpecId[local_24];
    }
  }
  if ((src->earlyFragmentTests & 1U) != 0) {
    this->earlyFragmentTests = true;
  }
  if ((src->earlyAndLateFragmentTestsAMD & 1U) != 0) {
    this->earlyAndLateFragmentTestsAMD = true;
  }
  if ((src->postDepthCoverage & 1U) != 0) {
    this->postDepthCoverage = true;
  }
  if ((src->nonCoherentColorAttachmentReadEXT & 1U) != 0) {
    this->nonCoherentColorAttachmentReadEXT = true;
  }
  if ((src->nonCoherentDepthAttachmentReadEXT & 1U) != 0) {
    this->nonCoherentDepthAttachmentReadEXT = true;
  }
  if ((src->nonCoherentStencilAttachmentReadEXT & 1U) != 0) {
    this->nonCoherentStencilAttachmentReadEXT = true;
  }
  if (src->layoutDepth != EldNone) {
    this->layoutDepth = src->layoutDepth;
  }
  if (src->layoutStencil != ElsNone) {
    this->layoutStencil = src->layoutStencil;
  }
  if ((src->blendEquation & 1U) != 0) {
    this->blendEquation = (bool)(src->blendEquation & 1);
  }
  if (src->numViews != -1) {
    this->numViews = src->numViews;
  }
  if ((src->layoutOverrideCoverage & 1U) != 0) {
    this->layoutOverrideCoverage = (bool)(src->layoutOverrideCoverage & 1);
  }
  if ((src->layoutDerivativeGroupQuads & 1U) != 0) {
    this->layoutDerivativeGroupQuads = (bool)(src->layoutDerivativeGroupQuads & 1);
  }
  if ((src->layoutDerivativeGroupLinear & 1U) != 0) {
    this->layoutDerivativeGroupLinear = (bool)(src->layoutDerivativeGroupLinear & 1);
  }
  if (src->primitives != -1) {
    this->primitives = src->primitives;
  }
  if (src->interlockOrdering != EioNone) {
    this->interlockOrdering = src->interlockOrdering;
  }
  if ((src->layoutPrimitiveCulling & 1U) != 0) {
    this->layoutPrimitiveCulling = (bool)(src->layoutPrimitiveCulling & 1);
  }
  return;
}

Assistant:

void merge(const TShaderQualifiers& src)
    {
        if (src.geometry != ElgNone)
            geometry = src.geometry;
        if (src.pixelCenterInteger)
            pixelCenterInteger = src.pixelCenterInteger;
        if (src.originUpperLeft)
            originUpperLeft = src.originUpperLeft;
        if (src.invocations != TQualifier::layoutNotSet)
            invocations = src.invocations;
        if (src.vertices != TQualifier::layoutNotSet)
            vertices = src.vertices;
        if (src.spacing != EvsNone)
            spacing = src.spacing;
        if (src.order != EvoNone)
            order = src.order;
        if (src.pointMode)
            pointMode = true;
        for (int i = 0; i < 3; ++i) {
            if (src.localSize[i] > 1)
                localSize[i] = src.localSize[i];
        }
        for (int i = 0; i < 3; ++i) {
            localSizeNotDefault[i] = src.localSizeNotDefault[i] || localSizeNotDefault[i];
        }
        for (int i = 0; i < 3; ++i) {
            if (src.localSizeSpecId[i] != TQualifier::layoutNotSet)
                localSizeSpecId[i] = src.localSizeSpecId[i];
        }
        if (src.earlyFragmentTests)
            earlyFragmentTests = true;
        if (src.earlyAndLateFragmentTestsAMD)
            earlyAndLateFragmentTestsAMD = true;
        if (src.postDepthCoverage)
            postDepthCoverage = true;
        if (src.nonCoherentColorAttachmentReadEXT)
            nonCoherentColorAttachmentReadEXT = true;
        if (src.nonCoherentDepthAttachmentReadEXT)
            nonCoherentDepthAttachmentReadEXT = true;
        if (src.nonCoherentStencilAttachmentReadEXT)
            nonCoherentStencilAttachmentReadEXT = true;
        if (src.layoutDepth)
            layoutDepth = src.layoutDepth;
        if (src.layoutStencil)
            layoutStencil = src.layoutStencil;
        if (src.blendEquation)
            blendEquation = src.blendEquation;
        if (src.numViews != TQualifier::layoutNotSet)
            numViews = src.numViews;
        if (src.layoutOverrideCoverage)
            layoutOverrideCoverage = src.layoutOverrideCoverage;
        if (src.layoutDerivativeGroupQuads)
            layoutDerivativeGroupQuads = src.layoutDerivativeGroupQuads;
        if (src.layoutDerivativeGroupLinear)
            layoutDerivativeGroupLinear = src.layoutDerivativeGroupLinear;
        if (src.primitives != TQualifier::layoutNotSet)
            primitives = src.primitives;
        if (src.interlockOrdering != EioNone)
            interlockOrdering = src.interlockOrdering;
        if (src.layoutPrimitiveCulling)
            layoutPrimitiveCulling = src.layoutPrimitiveCulling;
    }